

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_26::BinaryReader::ReadInitExpr(BinaryReader *this,Index index)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = ReadInstructions(this,this->read_end_,"init expression");
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    EVar2 = Ok;
    if (this->read_end_ < (this->state_).offset) {
      __assert_fail("state_.offset <= read_end_",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader.cc"
                    ,599,"Result wabt::(anonymous namespace)::BinaryReader::ReadInitExpr(Index)");
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadInitExpr(Index index) {
  CHECK_RESULT(ReadInstructions(read_end_, "init expression"));
  assert(state_.offset <= read_end_);
  return Result::Ok;
}